

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlChar * xmlSchemaValueGetAsString(xmlSchemaValPtr val)

{
  xmlChar *pxVar1;
  
  if (val != (xmlSchemaValPtr)0x0) {
    pxVar1 = (xmlChar *)0x0;
    if (((ulong)val->type < 0x2f) && ((0x400025d70006U >> ((ulong)val->type & 0x3f) & 1) != 0)) {
      pxVar1 = (xmlChar *)(val->value).decimal.lo;
    }
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlSchemaValueGetAsString(xmlSchemaValPtr val)
{
    if (val == NULL)
	return (NULL);
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_NORMSTRING:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	case XML_SCHEMAS_TOKEN:
        case XML_SCHEMAS_LANGUAGE:
        case XML_SCHEMAS_NMTOKEN:
        case XML_SCHEMAS_NAME:
        case XML_SCHEMAS_NCNAME:
        case XML_SCHEMAS_ID:
        case XML_SCHEMAS_IDREF:
        case XML_SCHEMAS_ENTITY:
        case XML_SCHEMAS_ANYURI:
	    return (BAD_CAST val->value.str);
	default:
	    break;
    }
    return (NULL);
}